

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::insert<std::_Rb_tree_const_iterator<int>>
          (void *param_1,undefined8 param_2,
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *param_3)

{
  unsigned_long uVar1;
  length_error *this_00;
  size_t dist;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this;
  int *in_stack_ffffffffffffff78;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff80;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff90;
  ulong uVar2;
  ulong local_28;
  int *in_stack_ffffffffffffffe8;
  
  local_28 = std::distance<std::_Rb_tree_const_iterator<int>>
                       (in_stack_ffffffffffffff90,(_Rb_tree_const_iterator<int>)param_1);
  uVar2 = local_28;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (uVar1 <= uVar2) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"insert-range overflow");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this,dist);
  while (local_28 != 0) {
    std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0xe462e3);
    in_stack_ffffffffffffff78 =
         get_key<int_const&>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0xe46301);
    insert_noresize<int_const&,int_const&>(param_3,in_stack_ffffffffffffffe8,(int *)param_1);
    local_28 = local_28 - 1;
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void insert(ForwardIterator f, ForwardIterator l, std::forward_iterator_tag) {
    size_t dist = std::distance(f, l);
    if (dist >= (std::numeric_limits<size_type>::max)()) {
      throw std::length_error("insert-range overflow");
    }
    resize_delta(static_cast<size_type>(dist));
    for (; dist > 0; --dist, ++f) {
      insert_noresize(get_key(*f), *f);
    }
  }